

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::AssertionHandler::handleExpr<bool>(AssertionHandler *this,ExprLhs<bool> *expr)

{
  ITransientExpression local_18;
  
  local_18.m_result = expr->m_lhs;
  local_18.m_isBinaryExpression = false;
  local_18._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_0022f508;
  local_18._10_1_ = local_18.m_result;
  handleExpr(this,&local_18);
  ITransientExpression::~ITransientExpression(&local_18);
  return;
}

Assistant:

auto makeUnaryExpr() const -> UnaryExpr<LhsT> {
            return UnaryExpr<LhsT>{ m_lhs };
        }